

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visualinfo.c
# Opt level: O1

GLboolean ParseArgs(int argc,char **argv)

{
  char *__s1;
  int iVar1;
  long lVar2;
  int iVar3;
  
  iVar3 = 0;
  if (0 < argc) {
    do {
      __s1 = argv[iVar3];
      iVar1 = strcmp(__s1,"-display");
      if (iVar1 == 0) {
        if (argc <= iVar3 + 1) {
          return '\x01';
        }
        display = argv[iVar3 + 1];
      }
      else {
        iVar1 = strcmp(__s1,"-visual");
        if (iVar1 != 0) {
          return '\x01';
        }
        if (argc <= iVar3 + 1) {
          return '\x01';
        }
        lVar2 = strtol(argv[iVar3 + 1],(char **)0x0,0);
        visual = (int)lVar2;
      }
      iVar3 = iVar3 + 2;
    } while (iVar3 < argc);
  }
  return '\0';
}

Assistant:

GLboolean ParseArgs (int argc, char** argv)
{
  int p = 0;
  while (p < argc)
  {
#if defined(_WIN32)
    if (!strcmp(argv[p], "-pf") || !strcmp(argv[p], "-pixelformat"))
    {
      if (++p >= argc) return GL_TRUE;
      display = NULL;
      visual = strtol(argv[p], NULL, 0);
    }
    else if (!strcmp(argv[p], "-a"))
    {
      showall = 1;
    }
    else if (!strcmp(argv[p], "-s"))
    {
      displaystdout = 1;
    }
    else if (!strcmp(argv[p], "-h"))
    {
      return GL_TRUE;
    }
    else
      return GL_TRUE;
#else
    if (!strcmp(argv[p], "-display"))
    {
      if (++p >= argc) return GL_TRUE;
      display = argv[p];
    }
    else if (!strcmp(argv[p], "-visual"))
    {
      if (++p >= argc) return GL_TRUE;
      visual = (int)strtol(argv[p], NULL, 0);
    }
    else if (!strcmp(argv[p], "-h"))
    {
      return GL_TRUE;
    }
    else
      return GL_TRUE;
#endif
    p++;
  }
  return GL_FALSE;
}